

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

void __thiscall
ktx::CommandCompare::compareKVD(CommandCompare *this,PrintDiff *diff,InputStreams *streams)

{
  Reporter *this_00;
  _Rb_tree_header *p_Var1;
  undefined1 *puVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  iterator iVar6;
  iterator iVar7;
  long lVar8;
  ulong __new_size;
  iterator this_01;
  _Rb_tree_header *p_Var9;
  uint uVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_02;
  iterator it [2];
  char *key;
  ktx_uint32_t keyLen;
  undefined8 local_f8;
  char *pcStack_f0;
  ktxHashList kvDataHead;
  vector<unsigned_char,_std::allocator<unsigned_char>_> keyValueStores [2];
  map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
  keys [2];
  
  if ((this->options).super_OptionsCompare.ignoreAllMetadata == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)keys,"Key/Value Data\n\n",(allocator<char> *)keyValueStores);
    PrintDiff::setContext(diff,(string *)keys);
    this_01._M_node = (_Base_ptr)keys;
    std::__cxx11::string::~string((string *)this_01._M_node);
    keyValueStores[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    keyValueStores[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    keyValueStores[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    keyValueStores[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    keyValueStores[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    keyValueStores[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar5 = 0;
    do {
      lVar8 = (long)&keys[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_color + lVar5;
      *(undefined8 *)((long)&keys[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + lVar5)
           = 0;
      *(undefined8 *)((long)&keys[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_left + lVar5) =
           0;
      *(undefined8 *)(&keys[0]._M_t._M_impl.field_0x0 + lVar5) = 0;
      *(undefined8 *)((long)&keys[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_color + lVar5)
           = 0;
      *(long *)((long)&keys[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_left + lVar5) = lVar8
      ;
      *(long *)((long)&keys[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_right + lVar5) =
           lVar8;
      *(undefined8 *)((long)&keys[0]._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar5) = 0;
      lVar5 = lVar5 + 0x30;
    } while (lVar5 != 0x60);
    this_00 = &(this->super_Command).super_Reporter;
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      __new_size = (ulong)(this->headers).
                          super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar5].keyValueData.byteLength;
      iVar6._M_node = it[0]._M_node;
      if (__new_size != 0) {
        this_02 = keyValueStores + lVar5;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_02,__new_size);
        local_f8 = 7;
        pcStack_f0 = "the KVD";
        read(this,(int)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (&streams->field_0x0 + lVar5 * 0x3b8),
             (void *)(ulong)(this->headers).
                            super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar5].keyValueData.byteOffset,
             (size_t)(this_02->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start);
        kvDataHead = (ktxHashList)0x0;
        this_01._M_node = (_Base_ptr)&kvDataHead;
        iVar4 = ktxHashList_Deserialize
                          (this_01._M_node,
                           (this->headers).
                           super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar5].keyValueData.byteLength,
                           (this_02->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start);
        if (iVar4 != 0) {
          this_01._M_node = (_Base_ptr)this_00;
          Reporter::fatal<char_const(&)[34],std::__cxx11::string_const&>
                    (this_00,DFD_FAILURE,(char (*) [34])"Failed to parse KVD in file \"{}\".",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (&streams->field_0x0 + lVar5 * 0x3b8));
        }
        iVar6._M_node = it[0]._M_node;
        if (kvDataHead != (ktxHashList)0x0) {
          iVar6._M_node = (_Base_ptr)kvDataHead;
          it[0]._M_node = this_01._M_node;
          for (uVar10 = 0;
              (this_01._M_node = it[0]._M_node, iVar6._M_node != (_Base_ptr)0x0 && (uVar10 < 100));
              uVar10 = uVar10 + 1) {
            it[0]._M_node = iVar6._M_node;
            ktxHashListEntry_GetKey(iVar6._M_node,&keyLen,&key);
            std::
            _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>>>
            ::_M_emplace_unique<char*&,ktxKVListEntry*&>
                      ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>>>
                        *)(keys + lVar5),&key,(ktxKVListEntry **)it);
            iVar6._M_node = (_Base_ptr)ktxHashList_Next();
          }
        }
      }
      it[0]._M_node = iVar6._M_node;
    }
    p_Var1 = &keys[0]._M_t._M_impl.super__Rb_tree_header;
    it[0]._M_node = keys[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    it[1]._M_node = keys[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_0012879e:
    if (((_Rb_tree_header *)it[0]._M_node != p_Var1) ||
       ((_Rb_tree_header *)it[1]._M_node != &keys[1]._M_t._M_impl.super__Rb_tree_header)) {
      p_Var9 = p_Var1;
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 8) {
        puVar2 = *(undefined1 **)((long)&it[0]._M_node + lVar5);
        if (p_Var9 != (_Rb_tree_header *)puVar2) {
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&kvDataHead,
                     (basic_string_view<char,_std::char_traits<char>_> *)(puVar2 + 0x20),
                     (allocator<char> *)&key);
          iVar7 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&(this->options).super_OptionsCompare.ignoreMetadataKeys._M_h,
                         (key_type *)&kvDataHead);
          this_01._M_node = (_Base_ptr)&kvDataHead;
          std::__cxx11::string::~string((string *)&kvDataHead);
          if (iVar7.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            this_01._M_node = (_Base_ptr)((long)&it[0]._M_node + lVar5);
            std::
            _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
            ::operator++((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
                          *)this_01._M_node,0);
            goto LAB_0012879e;
          }
        }
        p_Var9 = (_Rb_tree_header *)((long)(p_Var9 + 1) + 8);
      }
      if ((_Rb_tree_header *)it[0]._M_node == p_Var1) {
LAB_0012888d:
        if ((_Rb_tree_header *)it[1]._M_node == &keys[1]._M_t._M_impl.super__Rb_tree_header) {
LAB_001288e0:
          compareKVEntry((CommandCompare *)this_01._M_node,diff,(string_view *)(it[0]._M_node + 1),
                         (ktxHashListEntry *)it[0]._M_node[1]._M_left,
                         (ktxHashListEntry *)it[1]._M_node[1]._M_left);
          it[0]._M_node = (_Base_ptr)std::_Rb_tree_increment(it[0]._M_node);
        }
        else {
          if ((_Rb_tree_header *)it[0]._M_node != p_Var1) {
            this_01._M_node = it[0]._M_node[1];
            bVar3 = std::operator>(*(basic_string_view<char,_std::char_traits<char>_> *)
                                    (it[0]._M_node + 1),
                                   *(basic_string_view<char,_std::char_traits<char>_> *)
                                    (it[1]._M_node + 1));
            if (!bVar3) goto LAB_001288e0;
          }
          compareKVEntry((CommandCompare *)this_01._M_node,diff,(string_view *)(it[1]._M_node + 1),
                         (ktxHashListEntry *)0x0,(ktxHashListEntry *)it[1]._M_node[1]._M_left);
        }
        this_01._M_node = it[1]._M_node;
        it[1]._M_node = (_Base_ptr)std::_Rb_tree_increment(it[1]._M_node);
      }
      else {
        if ((_Rb_tree_header *)it[1]._M_node != &keys[1]._M_t._M_impl.super__Rb_tree_header) {
          this_01._M_node = it[0]._M_node[1];
          bVar3 = std::operator<(*(basic_string_view<char,_std::char_traits<char>_> *)
                                  (it[0]._M_node + 1),
                                 *(basic_string_view<char,_std::char_traits<char>_> *)
                                  (it[1]._M_node + 1));
          if (!bVar3) goto LAB_0012888d;
        }
        compareKVEntry((CommandCompare *)this_01._M_node,diff,(string_view *)(it[0]._M_node + 1),
                       (ktxHashListEntry *)it[0]._M_node[1]._M_left,(ktxHashListEntry *)0x0);
        this_01 = it[0];
        it[0]._M_node = (_Base_ptr)std::_Rb_tree_increment(it[0]._M_node);
      }
      goto LAB_0012879e;
    }
    lVar5 = 0x30;
    do {
      std::
      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
                   *)(&keys[0]._M_t._M_impl.field_0x0 + lVar5));
      lVar5 = lVar5 + -0x30;
    } while (lVar5 != -0x30);
    lVar5 = 0x18;
    do {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&keyValueStores[0].
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar5));
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != -0x18);
  }
  return;
}

Assistant:

void CommandCompare::compareKVD(PrintDiff& diff, InputStreams& streams) {
    if (options.ignoreAllMetadata) return;

    diff.setContext("Key/Value Data\n\n");

    std::vector<uint8_t> keyValueStores[2] = {};
    std::map<std::string_view, ktxHashListEntry*> keys[2] = {};

    for (std::size_t i = 0; i < streams.size(); ++i) {
        if (headers[i].keyValueData.byteLength == 0) continue;

        keyValueStores[i].resize(headers[i].keyValueData.byteLength);
        read(streams[i], headers[i].keyValueData.byteOffset, keyValueStores[i].data(),
            headers[i].keyValueData.byteLength, "the KVD");

        ktxHashList kvDataHead = nullptr;
        KTX_error_code result = ktxHashList_Deserialize(&kvDataHead,
            headers[i].keyValueData.byteLength, keyValueStores[i].data());
        if (result != KTX_SUCCESS)
            fatal(rc::KTX_FAILURE, "Failed to parse KVD in file \"{}\".", streams[i].str());

        if (kvDataHead == nullptr)
            continue;

        uint32_t entryIndex = 0;
        ktxHashListEntry* entry = kvDataHead;
        for (; entry != NULL && entryIndex < MAX_NUM_KV_ENTRIES; entry = ktxHashList_Next(entry), ++entryIndex) {
            char* key;
            ktx_uint32_t keyLen;
            ktxHashListEntry_GetKey(entry, &keyLen, &key);
            keys[i].emplace(key, entry);
        }
    }

    std::map<std::string_view, ktxHashListEntry*>::iterator it[2] = { keys[0].begin(), keys[1].begin() };
    while (it[0] != keys[0].end() || it[1] != keys[1].end()) {
        bool ignoreKey = false;
        for (std::size_t i = 0; i < streams.size(); ++i)
            if ((it[i] != keys[i].end()) &&
                (options.ignoreMetadataKeys.find(std::string(it[i]->first)) != options.ignoreMetadataKeys.end())) {
                // Key is on the ignore list, skip it
                it[i]++;
                ignoreKey = true;
                break;
            }
        if (ignoreKey) continue;

        if ((it[0] != keys[0].end()) && ((it[1] == keys[1].end()) || (it[0]->first < it[1]->first))) {
            // First stream has a key that is not present in the second stream
            compareKVEntry(diff, it[0]->first, it[0]->second, nullptr);
            it[0]++;
        } else if ((it[1] != keys[1].end()) && ((it[0] == keys[0].end()) || (it[0]->first > it[1]->first))) {
            // Second stream has a key that is not present in the first stream
            compareKVEntry(diff, it[1]->first, nullptr, it[1]->second);
            it[1]++;
        } else {
            // Both streams have the key
            compareKVEntry(diff, it[0]->first, it[0]->second, it[1]->second);
            it[0]++;
            it[1]++;
        }
    }
}